

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Morton.cpp
# Opt level: O0

void __thiscall
Resorting::MortonCode64::MortonCode64(MortonCode64 *this,int32_t x,int32_t y,int32_t z)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  int32_t z_local;
  int32_t y_local;
  int32_t x_local;
  MortonCode64 *this_local;
  
  if (x < -0x100000 || 0xfffff < x) {
    __assert_fail("-(1 << 20) <= x && x < (1 << 20)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/Morton.cpp"
                  ,0x33,"Resorting::MortonCode64::MortonCode64(int32_t, int32_t, int32_t)");
  }
  if (y < -0x100000 || 0xfffff < y) {
    __assert_fail("-(1 << 20) <= y && y < (1 << 20)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/Morton.cpp"
                  ,0x34,"Resorting::MortonCode64::MortonCode64(int32_t, int32_t, int32_t)");
  }
  if (z < -0x100000 || 0xfffff < z) {
    __assert_fail("-(1 << 20) <= z && z < (1 << 20)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/Morton.cpp"
                  ,0x35,"Resorting::MortonCode64::MortonCode64(int32_t, int32_t, int32_t)");
  }
  uVar1 = SplitBy3Bits21((x & 0x80000000U) >> 0xb | x & 0xfffffU);
  uVar2 = SplitBy3Bits21((y & 0x80000000U) >> 0xb | y & 0xfffffU);
  uVar3 = SplitBy3Bits21((z & 0x80000000U) >> 0xb | z & 0xfffffU);
  this->data = uVar1 | uVar2 << 1 | uVar3 << 2;
  this->data = this->data ^ 0x7000000000000000;
  return;
}

Assistant:

MortonCode64::MortonCode64(int32_t x, int32_t y, int32_t z)
{
    assert(-(1 << 20) <= x && x < (1 << 20));
    assert(-(1 << 20) <= y && y < (1 << 20));
    assert(-(1 << 20) <= z && z < (1 << 20));
    // move sign bit to bit 20
    x = (x & 0x80000000) >> 11 | (x & 0x0fffff);
    y = (y & 0x80000000) >> 11 | (y & 0x0fffff);
    z = (z & 0x80000000) >> 11 | (z & 0x0fffff);

    data = SplitBy3Bits21(x) | SplitBy3Bits21(y) << 1 | SplitBy3Bits21(z) << 2;
    // invert sign bits
    data = data ^ 0x7000000000000000;

    /*int32_t dx, dy, dz;
    decode(dx, dy, dz);
    assert(x == dx);
    assert(y == dy);
    assert(z == dz);*/
}